

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O0

bool __thiscall ssl_credential_st::UsesX509(ssl_credential_st *this)

{
  ssl_credential_st *this_local;
  
  if (this->type < kSPAKE2PlusV1Client) {
    this_local._7_1_ = true;
  }
  else {
    if (1 < this->type - kSPAKE2PlusV1Client) {
      abort();
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ssl_credential_st::UsesX509() const {
  switch (type) {
    case SSLCredentialType::kX509:
    case SSLCredentialType::kDelegated:
      return true;
    case SSLCredentialType::kSPAKE2PlusV1Client:
    case SSLCredentialType::kSPAKE2PlusV1Server:
      return false;
  }
  abort();
}